

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v7::vprint(FILE *f,string_view format_str,format_args args)

{
  memory_buffer buffer;
  
  buffer.super_buffer<char>.ptr_ = buffer.store_;
  buffer.super_buffer<char>.size_ = 0;
  buffer.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_001c6868;
  buffer.super_buffer<char>.capacity_ = 500;
  detail::vformat_to<char>
            (&buffer.super_buffer<char>,format_str,
             args.
             super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
             ,(locale_ref)0x0);
  detail::fwrite_fully(buffer.super_buffer<char>.ptr_,1,buffer.super_buffer<char>.size_,f);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::deallocate(&buffer);
  return;
}

Assistant:

FMT_FUNC void vprint(std::FILE* f, string_view format_str, format_args args) {
  memory_buffer buffer;
  detail::vformat_to(buffer, format_str,
                     basic_format_args<buffer_context<char>>(args));
#ifdef _WIN32
  auto fd = _fileno(f);
  if (_isatty(fd)) {
    detail::utf8_to_utf16 u16(string_view(buffer.data(), buffer.size()));
    auto written = detail::dword();
    if (!detail::WriteConsoleW(reinterpret_cast<void*>(_get_osfhandle(fd)),
                               u16.c_str(), static_cast<uint32_t>(u16.size()),
                               &written, nullptr)) {
      FMT_THROW(format_error("failed to write to console"));
    }
    return;
  }
#endif
  detail::fwrite_fully(buffer.data(), 1, buffer.size(), f);
}